

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItemPrivate::updateAncestorFlags(QGraphicsItemPrivate *this)

{
  QGraphicsItemPrivate *pQVar1;
  QList<QGraphicsItem_*> *this_00;
  qsizetype qVar2;
  const_reference ppQVar3;
  long in_RDI;
  int i;
  QGraphicsItemPrivate *pd;
  int flags;
  qsizetype in_stack_ffffffffffffffc8;
  int local_1c;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar4;
  
  uVar4 = 0;
  if (*(long *)(in_RDI + 0x90) != 0) {
    pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             data((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   *)(*(long *)(in_RDI + 0x90) + 8));
    uVar4 = (uint)((ulong)*(undefined8 *)&pQVar1->field_0x160 >> 0x10) & 0x1f;
    if ((*(ulong *)&pQVar1->field_0x160 >> 0x3d & 1) != 0) {
      uVar4 = uVar4 | 8;
    }
    if ((*(ulong *)&pQVar1->field_0x160 >> 0xd & 1) != 0) {
      uVar4 = uVar4 | 1;
    }
    if ((*(ulong *)&pQVar1->field_0x160 & 0x1000000000) != 0) {
      uVar4 = uVar4 | 2;
    }
    if ((*(ulong *)&pQVar1->field_0x160 & 0x2000000000) != 0) {
      uVar4 = uVar4 | 4;
    }
    if ((*(ulong *)&pQVar1->field_0x160 & 0x8000000000000) != 0) {
      uVar4 = uVar4 | 0x10;
    }
  }
  if (((uint)((ulong)*(undefined8 *)(in_RDI + 0x160) >> 0x10) & 0x1f) != uVar4) {
    *(ulong *)(in_RDI + 0x160) =
         *(ulong *)(in_RDI + 0x160) & 0xffffffffffe0ffff | (ulong)uVar4 << 0x10;
    local_1c = 0;
    while( true ) {
      this_00 = (QList<QGraphicsItem_*> *)(long)local_1c;
      qVar2 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)(in_RDI + 0x98));
      if (qVar2 <= (long)this_00) break;
      ppQVar3 = QList<QGraphicsItem_*>::at(this_00,in_stack_ffffffffffffffc8);
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                (&(*ppQVar3)->d_ptr);
      updateAncestorFlags((QGraphicsItemPrivate *)CONCAT44(uVar4,in_stack_fffffffffffffff0));
      local_1c = local_1c + 1;
    }
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::updateAncestorFlags()
{
    int flags = 0;
    if (parent) {
        // Inherit the parent's ancestor flags.
        QGraphicsItemPrivate *pd = parent->d_ptr.data();
        flags = pd->ancestorFlags;

        // Add in flags from the parent.
        if (pd->filtersDescendantEvents)
            flags |= AncestorFiltersChildEvents;
        if (pd->handlesChildEvents)
            flags |= AncestorHandlesChildEvents;
        if (pd->flags & QGraphicsItem::ItemClipsChildrenToShape)
            flags |= AncestorClipsChildren;
        if (pd->flags & QGraphicsItem::ItemIgnoresTransformations)
            flags |= AncestorIgnoresTransformations;
        if (pd->flags & QGraphicsItem::ItemContainsChildrenInShape)
            flags |= AncestorContainsChildren;
    }

    if (ancestorFlags == flags)
        return; // No change; stop propagation.
    ancestorFlags = flags;

    // Propagate to children recursively.
    for (int i = 0; i < children.size(); ++i)
        children.at(i)->d_ptr->updateAncestorFlags();
}